

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

size_t loader_impl_handle_name(plugin_manager manager,char *path,char *result)

{
  char *__string;
  int iVar1;
  long lVar2;
  ulong uVar3;
  undefined8 *puVar4;
  size_t sVar5;
  size_t sVar6;
  void *in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  size_t length;
  size_t path_size;
  size_t script_path_size;
  char *script_path;
  size_t size;
  size_t iterator;
  vector script_paths;
  ulong local_30;
  
  lVar2 = plugin_manager_impl(in_RDI);
  lVar2 = *(long *)(lVar2 + 0x18);
  if (lVar2 != 0) {
    uVar3 = vector_size(lVar2);
    for (local_30 = 0; local_30 < uVar3; local_30 = local_30 + 1) {
      puVar4 = (undefined8 *)vector_at(lVar2,local_30);
      __string = (char *)*puVar4;
      sVar5 = strnlen(__string,0x1000);
      sVar6 = strnlen(in_RSI,0x1000);
      iVar1 = portability_path_is_subpath(__string,sVar5 + 1,in_RSI,sVar6 + 1);
      if (iVar1 != 0) {
        lVar2 = portability_path_get_relative(__string,sVar5 + 1,in_RSI,sVar6 + 1,in_RDX,0x1000);
        return lVar2 - 1;
      }
    }
  }
  sVar5 = strnlen(in_RSI,0x1000);
  memcpy(in_RDX,in_RSI,sVar5 + 1);
  return sVar5;
}

Assistant:

size_t loader_impl_handle_name(plugin_manager manager, const loader_path path, loader_path result)
{
	vector script_paths = plugin_manager_impl_type(manager, loader_manager_impl)->script_paths;

	if (script_paths != NULL)
	{
		size_t iterator, size = vector_size(script_paths);

		/* TODO: Should scripts_path be sorted in order to prevent name collisions? */
		for (iterator = 0; iterator < size; ++iterator)
		{
			char *script_path = vector_at_type(script_paths, iterator, char *);
			size_t script_path_size = strnlen(script_path, LOADER_PATH_SIZE) + 1;
			size_t path_size = strnlen(path, LOADER_PATH_SIZE) + 1;

			if (portability_path_is_subpath(script_path, script_path_size, path, path_size))
			{
				return portability_path_get_relative(script_path, script_path_size, path, path_size, result, LOADER_PATH_SIZE) - 1;
			}
		}
	}

	size_t length = strnlen(path, LOADER_PATH_SIZE);

	memcpy(result, path, length + 1);

	return length;
}